

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_2,_1> __thiscall
tcu::operator*(tcu *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_1> *b)

{
  Matrix<float,_2,_1> MVar1;
  float *pfVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar3;
  undefined4 local_34;
  undefined4 local_30;
  int ndx;
  float v;
  int col;
  int row;
  Matrix<float,_2,_1> *b_local;
  Matrix<float,_2,_2> *a_local;
  Matrix<float,_2,_1> *res;
  
  Matrix<float,_2,_1>::Matrix((Matrix<float,_2,_1> *)this);
  local_30 = extraout_XMM0_Da;
  fVar3 = extraout_XMM0_Db;
  for (v = 0.0; (int)v < 2; v = (float)((int)v + 1)) {
    for (ndx = 0; ndx < 1; ndx = ndx + 1) {
      local_30 = 0.0;
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        pfVar2 = Matrix<float,_2,_2>::operator()(a,(int)v,local_34);
        fVar3 = *pfVar2;
        pfVar2 = Matrix<float,_2,_1>::operator()(b,local_34,ndx);
        local_30 = fVar3 * *pfVar2 + local_30;
      }
      pfVar2 = Matrix<float,_2,_1>::operator()((Matrix<float,_2,_1> *)this,(int)v,ndx);
      fVar3 = 0.0;
      *pfVar2 = local_30;
    }
  }
  MVar1.m_data.m_data[0].m_data[1] = fVar3;
  MVar1.m_data.m_data[0].m_data[0] = local_30;
  return (Matrix<float,_2,_1>)MVar1.m_data.m_data[0].m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}